

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *this_00;
  string *name;
  cmMakefile *pcVar1;
  pointer pcVar2;
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  first;
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  last;
  pointer pbVar3;
  pointer pCVar4;
  size_type sVar5;
  cmFindPackageCommand *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *__lhs;
  ostream *poVar11;
  long lVar12;
  byte bVar13;
  ConfigFileInfo *i;
  pointer pCVar14;
  char *pcVar15;
  undefined4 uVar16;
  char *unaff_R13;
  undefined7 uVar17;
  ConfigFileInfo *info;
  ConfigFileInfo *pCVar18;
  string consideredVersionsVar;
  string consideredVersions;
  string foundVar;
  string consideredConfigFiles;
  string notFoundMessage;
  string notFoundMessageVar;
  string upperFound;
  string upperDir;
  string fileVar;
  string consideredConfigsVar;
  string local_470;
  cmFindPackageCommand *local_450;
  ConfigFileInfo *local_448;
  string local_440;
  string local_420;
  string local_400;
  char *local_3e0;
  long local_3d8;
  char local_3d0;
  undefined7 uStack_3cf;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = &this->ConsideredConfigs;
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::_M_erase_at_end(this_00,(this->ConsideredConfigs).
                            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::UpperCase(&local_340,&this->Name);
  cmsys::SystemTools::UpperCase(&local_360,&this->Name);
  std::__cxx11::string::append((char *)&local_340);
  std::__cxx11::string::append((char *)&local_360);
  name = &this->Variable;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,name);
  local_450 = this;
  if (this->UseConfigFiles == true) {
    bVar7 = cmSystemTools::IsOff(paVar10->_M_local_buf);
    if (bVar7) {
      bVar7 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_320,paVar10->_M_local_buf,(allocator<char> *)local_1a8);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_320);
      bVar7 = cmsys::SystemTools::FileIsFullPath((string *)local_320);
      if (!bVar7) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
        __lhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                          ((local_450->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        this = local_450;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          this = local_450;
        }
      }
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar7 = FindConfigFile(this,(string *)local_320,(string *)local_1a8);
      if (bVar7) {
        std::__cxx11::string::_M_assign((string *)&this->FileFound);
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)cmMakefile::GetDefinition
                             ((this->super_cmFindCommon).super_cmCommand.Makefile,name);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
    }
    bVar8 = cmSystemTools::IsOff(paVar10->_M_local_buf);
    if ((bVar8) || (bVar7 == false)) {
      bVar7 = FindConfig(this);
    }
    unaff_R13 = (char *)paVar10;
    if ((bVar7 != false) && ((this->FileFound)._M_string_length == 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      local_320._0_8_ = local_320 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,"fileFound is true but FileFound is empty!","");
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,(string *)local_320);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      goto LAB_0024b56e;
    }
  }
  else {
LAB_0024b56e:
    bVar7 = false;
  }
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_420);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_3c0);
  local_3e0 = &local_3d0;
  local_3d8 = 0;
  local_3d0 = '\0';
  if (bVar7 != false) {
    bVar8 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_420);
    if ((bVar8) &&
       (bVar8 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_420),
       !bVar8)) {
      cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_420);
    }
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3c0);
    StoreVersionFound(this);
    bVar8 = ReadListFile(this,&this->FileFound,DoPolicyScope);
    if (!bVar8) {
      pcVar15 = "0";
      bVar8 = false;
      uVar16 = 0;
      goto LAB_0024c0c6;
    }
    bVar9 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_420);
    pcVar15 = "1";
    bVar8 = true;
    uVar17 = (undefined7)((ulong)unaff_R13 >> 8);
    if (!bVar9) {
      uVar16 = (undefined4)CONCAT71(uVar17,1);
      goto LAB_0024c0c6;
    }
    bVar9 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_420);
    unaff_R13 = (char *)CONCAT71(uVar17,1);
    uVar16 = SUB84(unaff_R13,0);
    if (bVar9) goto LAB_0024c0c6;
    cmMakefile::GetSafeDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_3c0);
    std::__cxx11::string::_M_assign((string *)&local_3e0);
  }
  if (this->Required == false) {
    unaff_R13 = (char *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    uVar16 = SUB84(unaff_R13,0);
    if (this->Quiet == false) {
      if (((this->UseConfigFiles != true) || (this->UseFindModules != false)) ||
         ((this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0024b6d2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Could NOT find ",0xf)
      ;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                           (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," (missing: ",0xb);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_DIR)",5);
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::DisplayStatus(pcVar1,(string *)local_1a8,-1.0);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
    }
  }
  else {
LAB_0024b6d2:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if (bVar7 == false) {
      first._M_current =
           (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      last._M_current =
           (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (first._M_current == last._M_current) {
        paVar10 = &local_470.field_2;
        local_470._M_string_length = 0;
        local_470.field_2._M_local_buf[0] = '\0';
        local_470._M_dataplus._M_p = (pointer)paVar10;
        if ((this->Version)._M_string_length != 0) {
          std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x4e87b3);
          std::__cxx11::string::_M_append
                    ((char *)&local_470,(ulong)(this->Version)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_470);
        }
        if (this->UseConfigFiles == true) {
          if (this->UseFindModules == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"By not providing \"Find",0x16);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,
                       ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                       ,0x6c);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\", but CMake did not find one.\n",0x1f);
          }
          if ((long)(this->Configs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Configs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"Could not find a package configuration file named \"",
                       0x33);
            pbVar3 = (this->Configs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(pbVar3->_M_dataplus)._M_p,
                                 pbVar3->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\" provided by package \"",0x17);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_470._M_dataplus._M_p,local_470._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "Could not find a package configuration file provided by \"",0x39);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_470._M_dataplus._M_p,local_470._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," with any of the following names:\n",0x22);
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"  ","");
            local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"");
            unaff_R13 = (char *)&local_3a0.field_2;
            local_3a0._M_dataplus._M_p = unaff_R13;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"\n","");
            cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_400,&local_440,&this->Configs,&local_380,&local_3a0);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_400._M_dataplus._M_p,local_400._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,
                              CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                       local_400.field_2._M_local_buf[0]) + 1);
            }
            if (local_3a0._M_dataplus._M_p != unaff_R13) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p,
                              CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                       local_440.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"Add the installation prefix of \"",0x20);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" to CMAKE_PREFIX_PATH or set \"",0x1f);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Variable)._M_dataplus._M_p,
                               (this->Variable)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" to a directory containing one of the above files. If \"",0x38);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
          lVar12 = 0x50;
          pcVar15 = 
          "\" provides a separate development package or SDK, be sure it has been installed.";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"No \"Find",8);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,".cmake\" found in ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"CMAKE_MODULE_PATH.",0x12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Find",4);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                     ,0x186);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
          lVar12 = 0xc9;
          pcVar15 = 
          ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
          ;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,lVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != paVar10) {
          operator_delete(local_470._M_dataplus._M_p,
                          CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                                   local_470.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        local_448 = (ConfigFileInfo *)
                    cmRemoveDuplicates<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>
                              (first,last);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Could not find a configuration file for package \"",0x31);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                             (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" that ",7);
        pcVar15 = "is compatible with";
        if ((ulong)this->VersionExact != 0) {
          pcVar15 = "exactly matches";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,pcVar15,((ulong)this->VersionExact ^ 1) * 3 + 0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," requested version \"",0x14);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(this->Version)._M_dataplus._M_p,
                             (this->Version)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"The following configuration files were considered but not accepted:\n",
                   0x44);
        pCVar18 = (this_00->
                  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (pCVar18 != local_448) {
          unaff_R13 = ", version: ";
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  ",2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(pCVar18->filename)._M_dataplus._M_p,
                                 (pCVar18->filename)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", version: ",0xb);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pCVar18->version)._M_dataplus._M_p,
                                 (pCVar18->version)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            pCVar18 = pCVar18 + 1;
          } while (pCVar18 != local_448);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Found package configuration file:\n  ",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(this->FileFound)._M_dataplus._M_p,
                           (this->FileFound)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nbut it set ",0xc);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_420._M_dataplus._M_p,local_420._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," to FALSE so package \"",0x16);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\" is considered to be NOT FOUND.",0x20);
      if (local_3d8 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320," Reason given by package: \n",0x1b);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,local_3e0,local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
    }
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    bVar7 = this->Required;
    std::__cxx11::stringbuf::str();
    bVar13 = bVar7 ^ 1;
    cmMakefile::IssueMessage(pcVar1,(uint)bVar13 + (uint)bVar13 * 2 + FATAL_ERROR,&local_470);
    pcVar6 = local_450;
    paVar10 = &local_470.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != paVar10) {
      operator_delete(local_470._M_dataplus._M_p,
                      CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                               local_470.field_2._M_local_buf[0]) + 1);
    }
    if (pcVar6->Required == true) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    std::__cxx11::stringbuf::str();
    sVar5 = local_470._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != paVar10) {
      operator_delete(local_470._M_dataplus._M_p,
                      CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                               local_470.field_2._M_local_buf[0]) + 1);
    }
    this = local_450;
    if (sVar5 != 0) {
      pcVar1 = (local_450->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_470);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar10) {
        operator_delete(local_470._M_dataplus._M_p,
                        CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                                 local_470.field_2._M_local_buf[0]) + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    uVar16 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  }
  pcVar15 = "0";
  bVar8 = false;
LAB_0024c0c6:
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_420,pcVar15);
  local_320._0_8_ = local_320 + 0x10;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_320,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_320);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  if (bVar8) {
    cmMakefile::AddDefinition(pcVar1,(string *)local_320,(this->FileFound)._M_dataplus._M_p);
  }
  else {
    cmMakefile::RemoveDefinition(pcVar1,(string *)local_320);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_1a8);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,pcVar2,pcVar2 + (this->Name)._M_string_length);
  local_448 = (ConfigFileInfo *)CONCAT44(local_448._4_4_,uVar16);
  std::__cxx11::string::append((char *)&local_470);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  local_440._M_string_length = 0;
  local_440.field_2._M_local_buf[0] = '\0';
  pCVar14 = (this->ConsideredConfigs).
            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar14 != pCVar4) {
    do {
      std::__cxx11::string::append((char *)&local_400);
      std::__cxx11::string::append((char *)&local_440);
      std::__cxx11::string::_M_append
                ((char *)&local_400,(ulong)(pCVar14->filename)._M_dataplus._M_p);
      std::__cxx11::string::_M_append((char *)&local_440,(ulong)(pCVar14->version)._M_dataplus._M_p)
      ;
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != pCVar4);
  }
  pcVar6 = local_450;
  cmMakefile::AddDefinition
            ((local_450->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_1a8,
             local_400._M_dataplus._M_p);
  cmMakefile::AddDefinition
            ((pcVar6->super_cmFindCommon).super_cmCommand.Makefile,&local_470,
             local_440._M_dataplus._M_p);
  pCVar18 = local_448;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,
                    CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                             local_440.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                             local_400.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                             local_470.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,CONCAT71(uStack_3cf,local_3d0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  return SUB81(pCVar18,0);
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles) {
    if (!cmSystemTools::IsOff(def)) {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if (!cmSystemTools::FileIsFullPath(dir)) {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
      }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file)) {
        this->FileFound = file;
        fileFound = true;
      }
      def = this->Makefile->GetDefinition(this->Variable);
    }

    // Search for the config file if it is not already found.
    if (cmSystemTools::IsOff(def) || !fileFound) {
      fileFound = this->FindConfig();
    }

    // Sanity check.
    if (fileFound && this->FileFound.empty()) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "fileFound is true but FileFound is empty!");
      fileFound = false;
    }
  }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if (fileFound) {
    if (this->Makefile->IsDefinitionSet(foundVar) &&
        !this->Makefile->IsOn(foundVar)) {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
    }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if (this->ReadListFile(this->FileFound, DoPolicyScope)) {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage =
          this->Makefile->GetSafeDefinition(notFoundMessageVar);
      }
    } else {
      // The configuration file is invalid.
      result = false;
    }
  }

  // package not found
  if (result && !found) {
    // warn if package required or neither quiet nor in config mode
    if (this->Required ||
        !(this->Quiet ||
          (this->UseConfigFiles && !this->UseFindModules &&
           this->ConsideredConfigs.empty()))) {
      // The variable is not set.
      std::ostringstream e;
      std::ostringstream aw;
      if (configFileSetFOUNDFalse) {
        /* clang-format off */
        e << "Found package configuration file:\n"
          "  " << this->FileFound << "\n"
          "but it set " << foundVar << " to FALSE so package \"" <<
          this->Name << "\" is considered to be NOT FOUND.";
        /* clang-format on */
        if (!notFoundMessage.empty()) {
          e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
      // If there are files in ConsideredConfigs, it means that FooConfig.cmake
      // have been found, but they didn't have appropriate versions.
      else if (!this->ConsideredConfigs.empty()) {
        std::vector<ConfigFileInfo>::const_iterator duplicate_end =
          cmRemoveDuplicates(this->ConsideredConfigs);
        e << "Could not find a configuration file for package \"" << this->Name
          << "\" that "
          << (this->VersionExact ? "exactly matches" : "is compatible with")
          << " requested version \"" << this->Version << "\".\n"
          << "The following configuration files were considered but not "
             "accepted:\n";

        for (ConfigFileInfo const& info :
             cmMakeRange(this->ConsideredConfigs.cbegin(), duplicate_end)) {
          e << "  " << info.filename << ", version: " << info.version << "\n";
        }
      } else {
        std::string requestedVersionString;
        if (!this->Version.empty()) {
          requestedVersionString = " (requested version ";
          requestedVersionString += this->Version;
          requestedVersionString += ")";
        }

        if (this->UseConfigFiles) {
          if (this->UseFindModules) {
            e << "By not providing \"Find" << this->Name
              << ".cmake\" in "
                 "CMAKE_MODULE_PATH this project has asked CMake to find a "
                 "package configuration file provided by \""
              << this->Name
              << "\", "
                 "but CMake did not find one.\n";
          }

          if (this->Configs.size() == 1) {
            e << "Could not find a package configuration file named \""
              << this->Configs[0] << "\" provided by package \"" << this->Name
              << "\"" << requestedVersionString << ".\n";
          } else {
            e << "Could not find a package configuration file provided by \""
              << this->Name << "\"" << requestedVersionString
              << " with any of the following names:\n"
              << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

          e << "Add the installation prefix of \"" << this->Name
            << "\" to "
               "CMAKE_PREFIX_PATH or set \""
            << this->Variable
            << "\" to a "
               "directory containing one of the above files. "
               "If \""
            << this->Name
            << "\" provides a separate development "
               "package or SDK, be sure it has been installed.";
        } else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
          e << "No \"Find" << this->Name << ".cmake\" found in "
            << "CMAKE_MODULE_PATH.";

          aw
            << "Find" << this->Name
            << ".cmake must either be part of this "
               "project itself, in this case adjust CMAKE_MODULE_PATH so that "
               "it points to the correct location inside its source tree.\n"
               "Or it must be installed by a package which has already been "
               "found via find_package().  In this case make sure that "
               "package has indeed been found and adjust CMAKE_MODULE_PATH to "
               "contain the location where that package has installed "
               "Find"
            << this->Name
            << ".cmake.  This must be a location "
               "provided by that package.  This error in general means that "
               "the buildsystem of this project is relying on a Find-module "
               "without ensuring that it is actually available.\n";
        }
      }

      this->Makefile->IssueMessage(this->Required ? MessageType::FATAL_ERROR
                                                  : MessageType::WARNING,
                                   e.str());
      if (this->Required) {
        cmSystemTools::SetFatalErrorOccured();
      }

      if (!aw.str().empty()) {
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, aw.str());
      }
    }
    // output result if in config mode but not in quiet mode
    else if (!this->Quiet) {
      std::ostringstream aw;
      aw << "Could NOT find " << this->Name << " (missing: " << this->Name
         << "_DIR)";
      this->Makefile->DisplayStatus(aw.str(), -1);
    }
  }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found ? "1" : "0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if (found) {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
  } else {
    this->Makefile->RemoveDefinition(fileVar);
  }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for (ConfigFileInfo const& i : this->ConsideredConfigs) {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += i.filename;
    consideredVersions += i.version;
    sep = ";";
  }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}